

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_queryiv(NegativeTestContext *ctx)

{
  allocator<char> local_39;
  string local_38;
  GLint local_14;
  NegativeTestContext *pNStack_10;
  GLint params;
  NegativeTestContext *ctx_local;
  
  local_14 = -1;
  pNStack_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_ENUM is generated if target or pname is not an accepted value.",&local_39);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glGetQueryiv(&pNStack_10->super_CallLogWrapper,0x8c2f,0xffffffff,&local_14);
  NegativeTestContext::expectError(pNStack_10,0x500);
  glu::CallLogWrapper::glGetQueryiv(&pNStack_10->super_CallLogWrapper,0xffffffff,0x8865,&local_14);
  NegativeTestContext::expectError(pNStack_10,0x500);
  glu::CallLogWrapper::glGetQueryiv
            (&pNStack_10->super_CallLogWrapper,0xffffffff,0xffffffff,&local_14);
  NegativeTestContext::expectError(pNStack_10,0x500);
  NegativeTestContext::endSection(pNStack_10);
  return;
}

Assistant:

void get_queryiv (NegativeTestContext& ctx)
{
	GLint params = -1;

	ctx.beginSection("GL_INVALID_ENUM is generated if target or pname is not an accepted value.");
	ctx.glGetQueryiv	(GL_ANY_SAMPLES_PASSED, -1, &params);
	ctx.expectError		(GL_INVALID_ENUM);
	ctx.glGetQueryiv	(-1, GL_CURRENT_QUERY, &params);
	ctx.expectError		(GL_INVALID_ENUM);
	ctx.glGetQueryiv	(-1, -1, &params);
	ctx.expectError		(GL_INVALID_ENUM);
	ctx.endSection();
}